

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio.c
# Opt level: O0

uint32_t FAudioVoice_SetOutputVoices(FAudioVoice *voice,FAudioVoiceSends *pSendList)

{
  code *pcVar1;
  uint32_t uVar2;
  int iVar3;
  FAudioSendDescriptor *pFVar4;
  float **ppfVar5;
  FAudioMixCallback *pp_Var6;
  float *pfVar7;
  FAudioFilterParameters *pFVar8;
  FAudioFilterState **ppafVar9;
  FAudioFilterState *pafVar10;
  uint *in_RSI;
  FAudioVoice *in_RDI;
  bool bVar11;
  SDL_AssertState sdl_assert_state_1;
  SDL_AssertState sdl_assert_state;
  FAudioSendDescriptor defaultSend;
  FAudioVoiceSends defaultSends;
  uint32_t outChannels;
  uint32_t i;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  FAudioVoice *in_stack_ffffffffffffffd8;
  uint local_20;
  uint local_1c;
  uint *local_18;
  uint32_t local_4;
  
  if (in_RDI->type == FAUDIO_VOICE_MASTER) {
    local_4 = 0x88960001;
  }
  else {
    FAudio_PlatformLockMutex((FAudioMutex)0x125c57);
    uVar2 = FAudio_INTERNAL_VoiceOutputFrequency
                      (in_stack_ffffffffffffffd8,
                       (FAudioVoiceSends *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    if (uVar2 == 0) {
      FAudio_PlatformLockMutex((FAudioMutex)0x125c9a);
      for (local_1c = 0; local_1c < (in_RDI->sends).SendCount; local_1c = local_1c + 1) {
        (*in_RDI->audio->pFree)(in_RDI->sendCoefficients[local_1c]);
      }
      if (in_RDI->sendCoefficients != (float **)0x0) {
        (*in_RDI->audio->pFree)(in_RDI->sendCoefficients);
      }
      for (local_1c = 0; local_1c < (in_RDI->sends).SendCount; local_1c = local_1c + 1) {
        (*in_RDI->audio->pFree)(in_RDI->mixCoefficients[local_1c]);
      }
      if (in_RDI->mixCoefficients != (float **)0x0) {
        (*in_RDI->audio->pFree)(in_RDI->mixCoefficients);
      }
      if (in_RDI->sendMix != (FAudioMixCallback *)0x0) {
        (*in_RDI->audio->pFree)(in_RDI->sendMix);
      }
      if (in_RDI->sendFilter != (FAudioFilterParameters *)0x0) {
        (*in_RDI->audio->pFree)(in_RDI->sendFilter);
        in_RDI->sendFilter = (FAudioFilterParameters *)0x0;
      }
      if (in_RDI->sendFilterState != (FAudioFilterState **)0x0) {
        for (local_1c = 0; local_1c < (in_RDI->sends).SendCount; local_1c = local_1c + 1) {
          if (in_RDI->sendFilterState[local_1c] != (FAudioFilterState *)0x0) {
            (*in_RDI->audio->pFree)(in_RDI->sendFilterState[local_1c]);
          }
        }
        (*in_RDI->audio->pFree)(in_RDI->sendFilterState);
        in_RDI->sendFilterState = (FAudioFilterState **)0x0;
      }
      if ((in_RDI->sends).pSends != (FAudioSendDescriptor *)0x0) {
        (*in_RDI->audio->pFree)((in_RDI->sends).pSends);
      }
      if (in_RSI == (uint *)0x0) {
        local_18 = (uint *)&stack0xffffffffffffffd4;
      }
      else {
        local_18 = in_RSI;
        if (*in_RSI == 0) {
          in_RDI->sendCoefficients = (float **)0x0;
          in_RDI->mixCoefficients = (float **)0x0;
          in_RDI->sendMix = (FAudioMixCallback *)0x0;
          SDL_memset(&in_RDI->sends,0,0xc);
          FAudio_PlatformUnlockMutex((FAudioMutex)0x125f17);
          FAudio_PlatformUnlockMutex((FAudioMutex)0x125f28);
          return 0;
        }
      }
      (in_RDI->sends).SendCount = *local_18;
      pFVar4 = (FAudioSendDescriptor *)(*in_RDI->audio->pMalloc)((ulong)*local_18 * 0xc);
      (in_RDI->sends).pSends = pFVar4;
      SDL_memcpy((in_RDI->sends).pSends,*(undefined8 *)(local_18 + 1),(ulong)*local_18 * 0xc);
      ppfVar5 = (float **)(*in_RDI->audio->pMalloc)((ulong)*local_18 << 3);
      in_RDI->sendCoefficients = ppfVar5;
      ppfVar5 = (float **)(*in_RDI->audio->pMalloc)((ulong)*local_18 << 3);
      in_RDI->mixCoefficients = ppfVar5;
      pp_Var6 = (FAudioMixCallback *)(*in_RDI->audio->pMalloc)((ulong)*local_18 << 3);
      in_RDI->sendMix = pp_Var6;
      for (local_1c = 0; local_1c < *local_18; local_1c = local_1c + 1) {
        if (*(int *)(*(long *)(*(long *)(local_18 + 1) + (ulong)local_1c * 0xc + 4) + 0xc) == 2) {
          local_20 = *(uint *)(*(long *)(*(long *)(local_18 + 1) + (ulong)local_1c * 0xc + 4) + 0xd8
                              );
        }
        else {
          local_20 = *(uint *)(*(long *)(*(long *)(local_18 + 1) + (ulong)local_1c * 0xc + 4) + 0xe8
                              );
        }
        pfVar7 = (float *)(*in_RDI->audio->pMalloc)
                                    ((ulong)in_RDI->outputChannels * 4 * (ulong)local_20);
        in_RDI->sendCoefficients[local_1c] = pfVar7;
        pfVar7 = (float *)(*in_RDI->audio->pMalloc)
                                    ((ulong)in_RDI->outputChannels * 4 * (ulong)local_20);
        in_RDI->mixCoefficients[local_1c] = pfVar7;
        do {
          bVar11 = false;
          if (in_RDI->outputChannels != 0) {
            bVar11 = in_RDI->outputChannels < 9;
          }
          if (!(bool)(bVar11 ^ 1)) goto LAB_0012617a;
          iVar3 = SDL_ReportAssertion(&FAudioVoice_SetOutputVoices::sdl_assert_data,
                                      "FAudioVoice_SetOutputVoices",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                      ,0x4cb);
        } while (iVar3 == 0);
        if (iVar3 == 1) {
          pcVar1 = (code *)swi(3);
          uVar2 = (*pcVar1)();
          return uVar2;
        }
LAB_0012617a:
        do {
          if (local_20 != 0 && local_20 < 9) goto LAB_001261d7;
          iVar3 = SDL_ReportAssertion(&FAudioVoice_SetOutputVoices::sdl_assert_data_1,
                                      "FAudioVoice_SetOutputVoices",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/0x0ade[P]FAudio/src/FAudio.c"
                                      ,0x4cc);
        } while (iVar3 == 0);
        if (iVar3 == 1) {
          pcVar1 = (code *)swi(3);
          uVar2 = (*pcVar1)();
          return uVar2;
        }
LAB_001261d7:
        SDL_memcpy(in_RDI->sendCoefficients[local_1c],
                   FAUDIO_INTERNAL_MATRIX_DEFAULTS[in_RDI->outputChannels - 1] + (local_20 - 1),
                   (ulong)(in_RDI->outputChannels * local_20) << 2);
        FAudio_RecalcMixMatrix(in_RDI,local_1c);
        if (in_RDI->outputChannels == 1) {
          if (local_20 == 1) {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_1in_1out_Scalar;
          }
          else if (local_20 == 2) {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_1in_2out_Scalar;
          }
          else if (local_20 == 6) {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_1in_6out_Scalar;
          }
          else if (local_20 == 8) {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_1in_8out_Scalar;
          }
          else {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_Generic;
          }
        }
        else if (in_RDI->outputChannels == 2) {
          if (local_20 == 1) {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_2in_1out_Scalar;
          }
          else if (local_20 == 2) {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_2in_2out_Scalar;
          }
          else if (local_20 == 6) {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_2in_6out_Scalar;
          }
          else if (local_20 == 8) {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_2in_8out_Scalar;
          }
          else {
            in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_Generic;
          }
        }
        else {
          in_RDI->sendMix[local_1c] = FAudio_INTERNAL_Mix_Generic;
        }
        if ((*(uint *)(*(long *)(local_18 + 1) + (ulong)local_1c * 0xc) & 0x80) != 0) {
          if (in_RDI->sendFilter == (FAudioFilterParameters *)0x0) {
            pFVar8 = (FAudioFilterParameters *)(*in_RDI->audio->pMalloc)((ulong)*local_18 * 0xc);
            in_RDI->sendFilter = pFVar8;
          }
          if (in_RDI->sendFilterState == (FAudioFilterState **)0x0) {
            ppafVar9 = (FAudioFilterState **)(*in_RDI->audio->pMalloc)((ulong)*local_18 << 3);
            in_RDI->sendFilterState = ppafVar9;
            SDL_memset(in_RDI->sendFilterState,0,(ulong)*local_18 << 3);
          }
          in_RDI->sendFilter[local_1c].Type = FAudioLowPassFilter;
          in_RDI->sendFilter[local_1c].Frequency = 1.0;
          in_RDI->sendFilter[local_1c].OneOverQ = 1.0;
          pafVar10 = (FAudioFilterState *)(*in_RDI->audio->pMalloc)((ulong)local_20 << 4);
          in_RDI->sendFilterState[local_1c] = pafVar10;
          SDL_memset(in_RDI->sendFilterState[local_1c],0,(ulong)local_20 << 4);
        }
      }
      FAudio_PlatformUnlockMutex((FAudioMutex)0x126556);
      FAudio_PlatformUnlockMutex((FAudioMutex)0x126567);
      local_4 = 0;
    }
    else {
      FAudio_PlatformUnlockMutex((FAudioMutex)0x125c7c);
      local_4 = 0x88960001;
    }
  }
  return local_4;
}

Assistant:

uint32_t FAudioVoice_SetOutputVoices(
	FAudioVoice *voice,
	const FAudioVoiceSends *pSendList
) {
	uint32_t i;
	uint32_t outChannels;
	FAudioVoiceSends defaultSends;
	FAudioSendDescriptor defaultSend;

	LOG_API_ENTER(voice->audio)

	if (voice->type == FAUDIO_VOICE_MASTER)
	{
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->sendLock);
	LOG_MUTEX_LOCK(voice->audio, voice->sendLock)

	if (FAudio_INTERNAL_VoiceOutputFrequency(voice, pSendList) != 0)
	{
		LOG_ERROR(
			voice->audio,
			"%s",
			"Changing the sample rate while an effect chain is attached is invalid!"
		)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return FAUDIO_E_INVALID_CALL;
	}

	FAudio_PlatformLockMutex(voice->volumeLock);
	LOG_MUTEX_LOCK(voice->audio, voice->volumeLock)

	/* FIXME: This is lazy... */
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->sendCoefficients[i]);
	}
	if (voice->sendCoefficients != NULL)
	{
		voice->audio->pFree(voice->sendCoefficients);
	}
	for (i = 0; i < voice->sends.SendCount; i += 1)
	{
		voice->audio->pFree(voice->mixCoefficients[i]);
	}
	if (voice->mixCoefficients != NULL)
	{
		voice->audio->pFree(voice->mixCoefficients);
	}
	if (voice->sendMix != NULL)
	{
		voice->audio->pFree(voice->sendMix);
	}
	if (voice->sendFilter != NULL)
	{
		voice->audio->pFree(voice->sendFilter);
		voice->sendFilter = NULL;
	}
	if (voice->sendFilterState != NULL)
	{
		for (i = 0; i < voice->sends.SendCount; i += 1)
		{
			if (voice->sendFilterState[i] != NULL)
			{
				voice->audio->pFree(voice->sendFilterState[i]);
			}
		}
		voice->audio->pFree(voice->sendFilterState);
		voice->sendFilterState = NULL;
	}
	if (voice->sends.pSends != NULL)
	{
		voice->audio->pFree(voice->sends.pSends);
	}

	if (pSendList == NULL)
	{
		/* Default to the mastering voice as output */
		defaultSend.Flags = 0;
		defaultSend.pOutputVoice = voice->audio->master;
		defaultSends.SendCount = 1;
		defaultSends.pSends = &defaultSend;
		pSendList = &defaultSends;
	}
	else if (pSendList->SendCount == 0)
	{
		/* No sends? Nothing to do... */
		voice->sendCoefficients = NULL;
		voice->mixCoefficients = NULL;
		voice->sendMix = NULL;
		FAudio_zero(&voice->sends, sizeof(FAudioVoiceSends));

		FAudio_PlatformUnlockMutex(voice->volumeLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)
		FAudio_PlatformUnlockMutex(voice->sendLock);
		LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
		LOG_API_EXIT(voice->audio)
		return 0;
	}

	/* Copy send list */
	voice->sends.SendCount = pSendList->SendCount;
	voice->sends.pSends = (FAudioSendDescriptor*) voice->audio->pMalloc(
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);
	FAudio_memcpy(
		voice->sends.pSends,
		pSendList->pSends,
		pSendList->SendCount * sizeof(FAudioSendDescriptor)
	);

	/* Allocate/Reset default output matrix, mixer function, filters */
	voice->sendCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->mixCoefficients = (float**) voice->audio->pMalloc(
		sizeof(float*) * pSendList->SendCount
	);
	voice->sendMix = (FAudioMixCallback*) voice->audio->pMalloc(
		sizeof(FAudioMixCallback) * pSendList->SendCount
	);

	for (i = 0; i < pSendList->SendCount; i += 1)
	{
		if (pSendList->pSends[i].pOutputVoice->type == FAUDIO_VOICE_MASTER)
		{
			outChannels = pSendList->pSends[i].pOutputVoice->master.inputChannels;
		}
		else
		{
			outChannels = pSendList->pSends[i].pOutputVoice->mix.inputChannels;
		}
		voice->sendCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);
		voice->mixCoefficients[i] = (float*) voice->audio->pMalloc(
			sizeof(float) * voice->outputChannels * outChannels
		);

		FAudio_assert(voice->outputChannels > 0 && voice->outputChannels < 9);
		FAudio_assert(outChannels > 0 && outChannels < 9);
		FAudio_memcpy(
			voice->sendCoefficients[i],
			FAUDIO_INTERNAL_MATRIX_DEFAULTS[voice->outputChannels - 1][outChannels - 1],
			voice->outputChannels * outChannels * sizeof(float)
		);
		FAudio_RecalcMixMatrix(voice, i);

		if (voice->outputChannels == 1)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_1in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
			}
		}
		else if (voice->outputChannels == 2)
		{
			if (outChannels == 1)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_1out_Scalar;
			}
			else if (outChannels == 2)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_2out_Scalar;
			}
			else if (outChannels == 6)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_6out_Scalar;
			}
			else if (outChannels == 8)
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_2in_8out_Scalar;
			}
			else
			{
				voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
			}
		}
		else
		{
			voice->sendMix[i] = FAudio_INTERNAL_Mix_Generic;
		}

		if (pSendList->pSends[i].Flags & FAUDIO_SEND_USEFILTER)
		{
			/* Allocate the whole send filter array if needed... */
			if (voice->sendFilter == NULL)
			{
				voice->sendFilter = (FAudioFilterParameters*) voice->audio->pMalloc(
					sizeof(FAudioFilterParameters) * pSendList->SendCount
				);
			}
			if (voice->sendFilterState == NULL)
			{
				voice->sendFilterState = (FAudioFilterState**) voice->audio->pMalloc(
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
				FAudio_zero(
					voice->sendFilterState,
					sizeof(FAudioFilterState*) * pSendList->SendCount
				);
			}

			/* ... then fill in this send's filter data */
			voice->sendFilter[i].Type = FAUDIO_DEFAULT_FILTER_TYPE;
			voice->sendFilter[i].Frequency = FAUDIO_DEFAULT_FILTER_FREQUENCY;
			voice->sendFilter[i].OneOverQ = FAUDIO_DEFAULT_FILTER_ONEOVERQ;
			voice->sendFilterState[i] = (FAudioFilterState*) voice->audio->pMalloc(
				sizeof(FAudioFilterState) * outChannels
			);
			FAudio_zero(
				voice->sendFilterState[i],
				sizeof(FAudioFilterState) * outChannels
			);
		}
	}

	FAudio_PlatformUnlockMutex(voice->volumeLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->volumeLock)

	FAudio_PlatformUnlockMutex(voice->sendLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->sendLock)
	LOG_API_EXIT(voice->audio)
	return 0;
}